

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::CheckIndexWithValue<wabt::SharedValidator::ElemType>
          (SharedValidator *this,Var *var,
          vector<wabt::SharedValidator::ElemType,_std::allocator<wabt::SharedValidator::ElemType>_>
          *values,ElemType *out,char *desc)

{
  pointer pEVar1;
  pointer pEVar2;
  Result RVar3;
  char *pcVar4;
  int __c;
  Var *__s;
  Type local_98;
  undefined8 uStack_90;
  Index local_88;
  Var local_78;
  
  Var::Var(&local_78,var);
  __s = &local_78;
  RVar3 = CheckIndex(this,&local_78,
                     (Index)(((long)(values->
                                    super__Vector_base<wabt::SharedValidator::ElemType,_std::allocator<wabt::SharedValidator::ElemType>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(values->
                                   super__Vector_base<wabt::SharedValidator::ElemType,_std::allocator<wabt::SharedValidator::ElemType>_>
                                   )._M_impl.super__Vector_impl_data._M_start) / 0x14),desc);
  Var::~Var(&local_78);
  if (out != (ElemType *)0x0) {
    if (RVar3.enum_ == Ok) {
      pcVar4 = Var::index(var,(char *)__s,__c);
      pEVar2 = (values->
               super__Vector_base<wabt::SharedValidator::ElemType,_std::allocator<wabt::SharedValidator::ElemType>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pEVar1 = pEVar2 + ((ulong)pcVar4 & 0xffffffff);
      local_98 = pEVar1->element;
      uStack_90._0_1_ = pEVar1->is_active;
      uStack_90._1_3_ = *(undefined3 *)&pEVar1->field_0x9;
      uStack_90._4_4_ = (pEVar1->table_type).enum_;
      local_88 = pEVar2[(ulong)pcVar4 & 0xffffffff].table_type.type_index_;
    }
    else {
      local_98.enum_ = Any;
      local_98.type_index_ = 0;
      uStack_90 = 0;
      local_88 = 0;
    }
    (out->table_type).type_index_ = local_88;
    out->element = local_98;
    out->is_active = (bool)(undefined1)uStack_90;
    *(undefined3 *)&out->field_0x9 = uStack_90._1_3_;
    (out->table_type).enum_ = uStack_90._4_4_;
  }
  return (Result)RVar3.enum_;
}

Assistant:

Result SharedValidator::CheckIndexWithValue(Var var,
                                            const std::vector<T>& values,
                                            T* out,
                                            const char* desc) {
  Result result = CheckIndex(var, values.size(), desc);
  if (out) {
    *out = Succeeded(result) ? values[var.index()] : T{};
  }
  return result;
}